

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkns(fitsfile *fptr,char *keyname,int nstart,int nmax,char **value,int *nfound,int *status)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int *in_R9;
  char *equalssign;
  char comm [73];
  char svalue [71];
  char card [81];
  char keyindex [8];
  char keyroot [75];
  long ival;
  int undefinedval;
  int tstatus;
  int mkeys;
  int nkeys;
  int ii;
  int lenroot;
  int nend;
  int *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe50;
  fitsfile *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffea8;
  long *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char local_108 [88];
  char local_b0 [8];
  char local_a8 [80];
  long local_58;
  int local_4c;
  undefined4 local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  int local_1c;
  int local_4;
  
  if (*(int *)equalssign < 1) {
    *in_R9 = 0;
    local_34 = in_EDX + in_ECX + -1;
    local_a8[0] = '\0';
    local_30 = in_R9;
    local_1c = in_EDX;
    strncat(local_a8,in_RSI,0x4a);
    sVar2 = strlen(local_a8);
    local_38 = (int)sVar2;
    if ((int)sVar2 == 0) {
      local_4 = *(int *)equalssign;
    }
    else {
      for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
        iVar1 = toupper((int)local_a8[local_3c]);
        local_a8[local_3c] = (char)iVar1;
      }
      ffghps(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (int *)0x1ceed5);
      local_4c = 0;
      for (local_3c = 3; local_3c <= local_40; local_3c = local_3c + 1) {
        iVar1 = ffgrec(in_stack_fffffffffffffe58,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                       (char *)in_stack_fffffffffffffe48,(int *)0x1cef23);
        if (0 < iVar1) {
          return *(int *)equalssign;
        }
        iVar1 = strncmp(local_a8,local_108,(long)local_38);
        if (iVar1 == 0) {
          local_b0[0] = '\0';
          in_stack_fffffffffffffe50 = (int *)strchr(local_108,0x3d);
          if (in_stack_fffffffffffffe50 != (int *)0x0) {
            if (7 < (long)((long)in_stack_fffffffffffffe50 + (-(long)local_38 - (long)local_108))) {
              equalssign[0] = -0x31;
              equalssign[1] = '\0';
              equalssign[2] = '\0';
              equalssign[3] = '\0';
              return 0xcf;
            }
            strncat(local_b0,local_108 + local_38,
                    (size_t)((long)in_stack_fffffffffffffe50 + (-(long)local_38 - (long)local_108)))
            ;
            local_48 = 0;
            iVar1 = ffc2ii(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                           in_stack_fffffffffffffea8);
            if (((iVar1 < 1) && (local_58 <= local_34)) && (local_1c <= local_58)) {
              ffpsvc(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0);
              ffc2s(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                    &in_stack_fffffffffffffe58->HDUposition);
              if ((long)*local_30 < (local_58 - local_1c) + 1) {
                *local_30 = ((int)local_58 - local_1c) + 1;
              }
              if (*(int *)equalssign == 0xcc) {
                local_4c = 1;
                equalssign[0] = '\0';
                equalssign[1] = '\0';
                equalssign[2] = '\0';
                equalssign[3] = '\0';
              }
            }
          }
        }
      }
      if ((local_4c != 0) && (*(int *)equalssign < 1)) {
        equalssign[0] = -0x34;
        equalssign[1] = '\0';
        equalssign[2] = '\0';
        equalssign[3] = '\0';
      }
      local_4 = *(int *)equalssign;
    }
  }
  else {
    local_4 = *(int *)equalssign;
  }
  return local_4;
}

Assistant:

int ffgkns( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            char *value[],      /* O - array of pointers to keyword values  */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
  This routine does NOT support the HEASARC long string convention.
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);
     
    lenroot = strlen(keyroot);
    
    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);

    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgrec(fptr, ii, card, status) > 0)     /*  get next keyword  */
           return(*status);

       if (strncmp(keyroot, card, lenroot) == 0)  /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */
          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)     /*  test suffix  */
          {
             if (ival <= nend && ival >= nstart)
             {
                ffpsvc(card, svalue, comm, status);  /*  parse the value */
                ffc2s(svalue, value[ival-nstart], status); /* convert */
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                   undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}